

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alffplay.cpp
# Opt level: O0

int __thiscall anon_unknown.dwarf_f6f6::AudioState::handler(AudioState *this)

{
  AVSampleFormat AVar1;
  value_type_conflict vVar2;
  char cVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  undefined4 uVar8;
  size_type sVar9;
  const_pointer pvVar10;
  pointer pAVar11;
  unsigned_long_long n;
  ostream *poVar12;
  int64_t iVar13;
  int64_t iVar14;
  reference pvVar15;
  pointer pSVar16;
  double *pdVar17;
  pointer pvVar18;
  reference pvVar19;
  rep rVar20;
  undefined8 *puVar21;
  undefined8 uVar22;
  int *piVar23;
  uint8_t *samples_00;
  uint8_t *puVar24;
  int iVar25;
  long in_RDI;
  array<unsigned_int,_40UL> *this_00;
  __type _Var26;
  int64_t devtime_1;
  ALuint bufid_1;
  bool got_audio;
  int sync_skip;
  ALuint bid;
  ALint queued;
  ALint processed;
  ALenum state;
  duration<long,_std::ratio<1L,_1000000000L>_> skip;
  int64_t devtime;
  int ret;
  ALCint refresh;
  ALuint bufid;
  iterator __end2;
  iterator __begin2;
  array<unsigned_int,_40UL> *__range2;
  float angles [2];
  vector<double,_std::allocator<double>_> mtx;
  ALsizei buffer_len;
  void *samples;
  int order_2;
  int order_1;
  int order;
  ALenum ambi_scale;
  ALenum ambi_layout;
  bool has_bfmt_ex;
  array<int,_3UL> evt_types;
  ALenum fmt;
  milliseconds sleep_time;
  unique_lock<std::mutex> srclock;
  memory_order __b_1;
  memory_order __b;
  undefined4 in_stack_fffffffffffffac8;
  undefined4 in_stack_fffffffffffffacc;
  undefined4 in_stack_fffffffffffffad0;
  memory_order in_stack_fffffffffffffad4;
  allocator_type *__a;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffae0;
  duration<long,_std::ratio<1L,_1000000000L>_> *in_stack_fffffffffffffae8;
  undefined4 in_stack_fffffffffffffaf0;
  undefined4 in_stack_fffffffffffffaf4;
  unique_lock<std::mutex> *in_stack_fffffffffffffaf8;
  code *pcVar27;
  uint in_stack_fffffffffffffb04;
  AVCodecContext *in_stack_fffffffffffffb20;
  PacketQueue<2097152UL> *in_stack_fffffffffffffb28;
  AudioState *in_stack_fffffffffffffb40;
  undefined4 in_stack_fffffffffffffb48;
  uint in_stack_fffffffffffffb4c;
  undefined4 in_stack_fffffffffffffb58;
  int in_stack_fffffffffffffb5c;
  undefined4 in_stack_fffffffffffffbc8;
  AudioState *in_stack_fffffffffffffbd0;
  uint64_t local_328;
  duration<long,std::ratio<1l,1000000000l>> local_1e0 [8];
  rep local_1d8;
  long local_1d0;
  value_type_conflict local_1c4;
  undefined1 local_1bd;
  int local_1bc;
  undefined1 local_1b8 [4];
  uint local_1b4;
  int local_1b0;
  int local_1ac;
  duration<long,std::ratio<1l,1l>> local_1a8 [16];
  rep local_198;
  int local_18c;
  duration<long,std::ratio<1l,1000000000l>> local_188 [8];
  rep local_180;
  long local_178;
  int local_16c;
  rep local_168;
  duration<long,_std::ratio<1L,_1L>_> local_160;
  int local_154;
  duration<long,std::ratio<1l,1l>> local_150 [16];
  rep local_140;
  undefined4 local_134;
  rep local_130;
  duration<long,_std::ratio<1L,_1L>_> local_128;
  rep local_120;
  duration<long,_std::ratio<1L,_1L>_> local_118;
  value_type_conflict local_10c;
  iterator local_108;
  iterator local_100;
  long local_f8;
  undefined8 local_f0 [2];
  undefined8 local_e0;
  vector<double,_std::allocator<double>_> local_d8;
  int local_bc;
  AudioState *local_b8;
  int local_ac;
  int local_a8;
  int local_a4;
  undefined4 local_a0;
  undefined4 local_9c;
  byte local_95;
  array<int,_3UL> local_88;
  int local_7c;
  rep local_78;
  unique_lock<std::mutex> local_68;
  int local_50;
  undefined4 local_4c;
  char *local_48;
  undefined8 local_40;
  memory_order local_38;
  int local_34;
  undefined8 local_30;
  undefined8 *local_28;
  undefined8 local_20;
  memory_order local_18;
  int local_14;
  undefined8 local_10;
  undefined8 *local_8;
  
  std::unique_lock<std::mutex>::unique_lock(&local_68,in_RDI + 0x148);
  pcVar27 = (anonymous_namespace)::alEventControlSOFT;
  local_78 = 6;
  local_88._M_elems[0] = 0x19a4;
  local_88._M_elems[1] = 0x19a5;
  local_88._M_elems[2] = 0x19a6;
  if ((anonymous_namespace)::alEventControlSOFT != (code *)0x0) {
    sVar9 = std::array<int,_3UL>::size(&local_88);
    pvVar10 = std::array<int,_3UL>::data((array<int,_3UL> *)0x111ef4);
    (*pcVar27)(sVar9 & 0xffffffff,pvVar10,1);
    (*(anonymous_namespace)::alEventCallbackSOFT)(EventCallback,in_RDI);
    local_78 = 800;
  }
  cVar3 = alIsExtensionPresent("AL_SOFT_bformat_ex");
  local_95 = cVar3 != '\0';
  local_9c = 0;
  local_a0 = 0;
  *(undefined8 *)(in_RDI + 0xf8) = 0;
  *(undefined4 *)(in_RDI + 0x140) = 0;
  pAVar11 = std::unique_ptr<AVCodecContext,_(anonymous_namespace)::AVCodecCtxDeleter>::operator->
                      ((unique_ptr<AVCodecContext,_(anonymous_namespace)::AVCodecCtxDeleter> *)
                       0x111fbd);
  if (((pAVar11->sample_fmt == AV_SAMPLE_FMT_FLT) ||
      (pAVar11 = std::unique_ptr<AVCodecContext,_(anonymous_namespace)::AVCodecCtxDeleter>::
                 operator->((unique_ptr<AVCodecContext,_(anonymous_namespace)::AVCodecCtxDeleter> *)
                            0x111fd7), pAVar11->sample_fmt == AV_SAMPLE_FMT_FLTP)) &&
     (cVar3 = alIsExtensionPresent("AL_EXT_FLOAT32"), cVar3 != '\0')) {
    *(undefined4 *)(in_RDI + 0x100) = 3;
    *(undefined4 *)(in_RDI + 0x144) = 4;
    pAVar11 = std::unique_ptr<AVCodecContext,_(anonymous_namespace)::AVCodecCtxDeleter>::operator->
                        ((unique_ptr<AVCodecContext,_(anonymous_namespace)::AVCodecCtxDeleter> *)
                         0x11202d);
    if (((pAVar11->channel_layout == 0x63f) &&
        (cVar3 = alIsExtensionPresent("AL_EXT_MCFORMATS"), cVar3 != '\0')) &&
       ((local_7c = alGetEnumValue("AL_FORMAT_71CHN32"), local_7c != 0 && (local_7c != -1)))) {
      pAVar11 = std::unique_ptr<AVCodecContext,_(anonymous_namespace)::AVCodecCtxDeleter>::
                operator->((unique_ptr<AVCodecContext,_(anonymous_namespace)::AVCodecCtxDeleter> *)
                           0x1120a1);
      *(uint64_t *)(in_RDI + 0xf8) = pAVar11->channel_layout;
      *(int *)(in_RDI + 0x144) = *(int *)(in_RDI + 0x144) << 3;
      *(int *)(in_RDI + 0x140) = local_7c;
    }
    pAVar11 = std::unique_ptr<AVCodecContext,_(anonymous_namespace)::AVCodecCtxDeleter>::operator->
                        ((unique_ptr<AVCodecContext,_(anonymous_namespace)::AVCodecCtxDeleter> *)
                         0x1120e7);
    if (((pAVar11->channel_layout == 0x60f) ||
        (pAVar11 = std::unique_ptr<AVCodecContext,_(anonymous_namespace)::AVCodecCtxDeleter>::
                   operator->((unique_ptr<AVCodecContext,_(anonymous_namespace)::AVCodecCtxDeleter>
                               *)0x112105), pAVar11->channel_layout == 0x3f)) &&
       ((cVar3 = alIsExtensionPresent("AL_EXT_MCFORMATS"), cVar3 != '\0' &&
        ((local_7c = alGetEnumValue("AL_FORMAT_51CHN32"), local_7c != 0 && (local_7c != -1)))))) {
      pAVar11 = std::unique_ptr<AVCodecContext,_(anonymous_namespace)::AVCodecCtxDeleter>::
                operator->((unique_ptr<AVCodecContext,_(anonymous_namespace)::AVCodecCtxDeleter> *)
                           0x112176);
      *(uint64_t *)(in_RDI + 0xf8) = pAVar11->channel_layout;
      *(int *)(in_RDI + 0x144) = *(int *)(in_RDI + 0x144) * 6;
      *(int *)(in_RDI + 0x140) = local_7c;
    }
    pAVar11 = std::unique_ptr<AVCodecContext,_(anonymous_namespace)::AVCodecCtxDeleter>::operator->
                        ((unique_ptr<AVCodecContext,_(anonymous_namespace)::AVCodecCtxDeleter> *)
                         0x1121ba);
    if (pAVar11->channel_layout == 4) {
      pAVar11 = std::unique_ptr<AVCodecContext,_(anonymous_namespace)::AVCodecCtxDeleter>::
                operator->((unique_ptr<AVCodecContext,_(anonymous_namespace)::AVCodecCtxDeleter> *)
                           0x1121d5);
      *(uint64_t *)(in_RDI + 0xf8) = pAVar11->channel_layout;
      *(undefined4 *)(in_RDI + 0x144) = *(undefined4 *)(in_RDI + 0x144);
      *(undefined4 *)(in_RDI + 0x140) = 0x10010;
    }
    pAVar11 = std::unique_ptr<AVCodecContext,_(anonymous_namespace)::AVCodecCtxDeleter>::operator->
                        ((unique_ptr<AVCodecContext,_(anonymous_namespace)::AVCodecCtxDeleter> *)
                         0x112218);
    if ((((pAVar11->channel_layout == 0) &&
         (pAVar11 = std::unique_ptr<AVCodecContext,_(anonymous_namespace)::AVCodecCtxDeleter>::
                    operator->((unique_ptr<AVCodecContext,_(anonymous_namespace)::AVCodecCtxDeleter>
                                *)0x112237), 3 < pAVar11->channels)) &&
        (cVar3 = alIsExtensionPresent("AL_EXT_BFORMAT"), cVar3 != '\0')) &&
       ((local_7c = alGetEnumValue("AL_FORMAT_BFORMAT3D_FLOAT32"), local_7c != 0 && (local_7c != -1)
        ))) {
      pAVar11 = std::unique_ptr<AVCodecContext,_(anonymous_namespace)::AVCodecCtxDeleter>::
                operator->((unique_ptr<AVCodecContext,_(anonymous_namespace)::AVCodecCtxDeleter> *)
                           0x1122b3);
      _Var26 = std::sqrt<int>(pAVar11->channels);
      iVar6 = (int)_Var26;
      local_a4 = iVar6 + -1;
      pAVar11 = std::unique_ptr<AVCodecContext,_(anonymous_namespace)::AVCodecCtxDeleter>::
                operator->((unique_ptr<AVCodecContext,_(anonymous_namespace)::AVCodecCtxDeleter> *)
                           0x11230f);
      if ((iVar6 * iVar6 == pAVar11->channels) ||
         (iVar6 = local_a4 + 1, iVar25 = local_a4 + 1,
         pAVar11 = std::unique_ptr<AVCodecContext,_(anonymous_namespace)::AVCodecCtxDeleter>::
                   operator->((unique_ptr<AVCodecContext,_(anonymous_namespace)::AVCodecCtxDeleter>
                               *)0x112353), iVar6 * iVar25 + 2 == pAVar11->channels)) {
        *(int *)(in_RDI + 0x144) = *(int *)(in_RDI + 0x144) << 2;
        *(int *)(in_RDI + 0x140) = local_7c;
      }
    }
    if (*(int *)(in_RDI + 0x140) == 0) {
      *(undefined8 *)(in_RDI + 0xf8) = 3;
      *(int *)(in_RDI + 0x144) = *(int *)(in_RDI + 0x144) << 1;
      *(undefined4 *)(in_RDI + 0x140) = 0x10011;
    }
  }
  pAVar11 = std::unique_ptr<AVCodecContext,_(anonymous_namespace)::AVCodecCtxDeleter>::operator->
                      ((unique_ptr<AVCodecContext,_(anonymous_namespace)::AVCodecCtxDeleter> *)
                       0x1123da);
  if ((pAVar11->sample_fmt == AV_SAMPLE_FMT_U8) ||
     (pAVar11 = std::unique_ptr<AVCodecContext,_(anonymous_namespace)::AVCodecCtxDeleter>::
                operator->((unique_ptr<AVCodecContext,_(anonymous_namespace)::AVCodecCtxDeleter> *)
                           0x1123f4), pAVar11->sample_fmt == AV_SAMPLE_FMT_U8P)) {
    *(undefined4 *)(in_RDI + 0x100) = 0;
    *(undefined4 *)(in_RDI + 0x144) = 1;
    pAVar11 = std::unique_ptr<AVCodecContext,_(anonymous_namespace)::AVCodecCtxDeleter>::operator->
                        ((unique_ptr<AVCodecContext,_(anonymous_namespace)::AVCodecCtxDeleter> *)
                         0x112426);
    if ((pAVar11->channel_layout == 0x63f) &&
       (((cVar3 = alIsExtensionPresent("AL_EXT_MCFORMATS"), cVar3 != '\0' &&
         (local_7c = alGetEnumValue("AL_FORMAT_71CHN8"), local_7c != 0)) && (local_7c != -1)))) {
      pAVar11 = std::unique_ptr<AVCodecContext,_(anonymous_namespace)::AVCodecCtxDeleter>::
                operator->((unique_ptr<AVCodecContext,_(anonymous_namespace)::AVCodecCtxDeleter> *)
                           0x11249a);
      *(uint64_t *)(in_RDI + 0xf8) = pAVar11->channel_layout;
      *(int *)(in_RDI + 0x144) = *(int *)(in_RDI + 0x144) << 3;
      *(int *)(in_RDI + 0x140) = local_7c;
    }
    pAVar11 = std::unique_ptr<AVCodecContext,_(anonymous_namespace)::AVCodecCtxDeleter>::operator->
                        ((unique_ptr<AVCodecContext,_(anonymous_namespace)::AVCodecCtxDeleter> *)
                         0x1124e0);
    if (((pAVar11->channel_layout == 0x60f) ||
        (pAVar11 = std::unique_ptr<AVCodecContext,_(anonymous_namespace)::AVCodecCtxDeleter>::
                   operator->((unique_ptr<AVCodecContext,_(anonymous_namespace)::AVCodecCtxDeleter>
                               *)0x1124fe), pAVar11->channel_layout == 0x3f)) &&
       ((cVar3 = alIsExtensionPresent("AL_EXT_MCFORMATS"), cVar3 != '\0' &&
        ((local_7c = alGetEnumValue("AL_FORMAT_51CHN8"), local_7c != 0 && (local_7c != -1)))))) {
      pAVar11 = std::unique_ptr<AVCodecContext,_(anonymous_namespace)::AVCodecCtxDeleter>::
                operator->((unique_ptr<AVCodecContext,_(anonymous_namespace)::AVCodecCtxDeleter> *)
                           0x11256f);
      *(uint64_t *)(in_RDI + 0xf8) = pAVar11->channel_layout;
      *(int *)(in_RDI + 0x144) = *(int *)(in_RDI + 0x144) * 6;
      *(int *)(in_RDI + 0x140) = local_7c;
    }
    pAVar11 = std::unique_ptr<AVCodecContext,_(anonymous_namespace)::AVCodecCtxDeleter>::operator->
                        ((unique_ptr<AVCodecContext,_(anonymous_namespace)::AVCodecCtxDeleter> *)
                         0x1125b3);
    if (pAVar11->channel_layout == 4) {
      pAVar11 = std::unique_ptr<AVCodecContext,_(anonymous_namespace)::AVCodecCtxDeleter>::
                operator->((unique_ptr<AVCodecContext,_(anonymous_namespace)::AVCodecCtxDeleter> *)
                           0x1125ce);
      *(uint64_t *)(in_RDI + 0xf8) = pAVar11->channel_layout;
      *(undefined4 *)(in_RDI + 0x144) = *(undefined4 *)(in_RDI + 0x144);
      *(undefined4 *)(in_RDI + 0x140) = 0x1100;
    }
    pAVar11 = std::unique_ptr<AVCodecContext,_(anonymous_namespace)::AVCodecCtxDeleter>::operator->
                        ((unique_ptr<AVCodecContext,_(anonymous_namespace)::AVCodecCtxDeleter> *)
                         0x112611);
    if ((((pAVar11->channel_layout == 0) &&
         (pAVar11 = std::unique_ptr<AVCodecContext,_(anonymous_namespace)::AVCodecCtxDeleter>::
                    operator->((unique_ptr<AVCodecContext,_(anonymous_namespace)::AVCodecCtxDeleter>
                                *)0x112630), 3 < pAVar11->channels)) &&
        (cVar3 = alIsExtensionPresent("AL_EXT_BFORMAT"), cVar3 != '\0')) &&
       ((local_7c = alGetEnumValue("AL_FORMAT_BFORMAT3D8"), local_7c != 0 && (local_7c != -1)))) {
      pAVar11 = std::unique_ptr<AVCodecContext,_(anonymous_namespace)::AVCodecCtxDeleter>::
                operator->((unique_ptr<AVCodecContext,_(anonymous_namespace)::AVCodecCtxDeleter> *)
                           0x1126ac);
      _Var26 = std::sqrt<int>(pAVar11->channels);
      iVar6 = (int)_Var26;
      local_a8 = iVar6 + -1;
      pAVar11 = std::unique_ptr<AVCodecContext,_(anonymous_namespace)::AVCodecCtxDeleter>::
                operator->((unique_ptr<AVCodecContext,_(anonymous_namespace)::AVCodecCtxDeleter> *)
                           0x112708);
      if ((iVar6 * iVar6 == pAVar11->channels) ||
         (iVar6 = local_a8 + 1, iVar25 = local_a8 + 1,
         pAVar11 = std::unique_ptr<AVCodecContext,_(anonymous_namespace)::AVCodecCtxDeleter>::
                   operator->((unique_ptr<AVCodecContext,_(anonymous_namespace)::AVCodecCtxDeleter>
                               *)0x11274c), iVar6 * iVar25 + 2 == pAVar11->channels)) {
        *(int *)(in_RDI + 0x144) = *(int *)(in_RDI + 0x144) << 2;
        *(int *)(in_RDI + 0x140) = local_7c;
      }
    }
    if (*(int *)(in_RDI + 0x140) == 0) {
      *(undefined8 *)(in_RDI + 0xf8) = 3;
      *(int *)(in_RDI + 0x144) = *(int *)(in_RDI + 0x144) << 1;
      *(undefined4 *)(in_RDI + 0x140) = 0x1102;
    }
  }
  if (*(int *)(in_RDI + 0x140) == 0) {
    *(undefined4 *)(in_RDI + 0x100) = 1;
    *(undefined4 *)(in_RDI + 0x144) = 2;
    pAVar11 = std::unique_ptr<AVCodecContext,_(anonymous_namespace)::AVCodecCtxDeleter>::operator->
                        ((unique_ptr<AVCodecContext,_(anonymous_namespace)::AVCodecCtxDeleter> *)
                         0x1127fc);
    if (((pAVar11->channel_layout == 0x63f) &&
        (cVar3 = alIsExtensionPresent("AL_EXT_MCFORMATS"), cVar3 != '\0')) &&
       ((local_7c = alGetEnumValue("AL_FORMAT_71CHN16"), local_7c != 0 && (local_7c != -1)))) {
      pAVar11 = std::unique_ptr<AVCodecContext,_(anonymous_namespace)::AVCodecCtxDeleter>::
                operator->((unique_ptr<AVCodecContext,_(anonymous_namespace)::AVCodecCtxDeleter> *)
                           0x112870);
      *(uint64_t *)(in_RDI + 0xf8) = pAVar11->channel_layout;
      *(int *)(in_RDI + 0x144) = *(int *)(in_RDI + 0x144) << 3;
      *(int *)(in_RDI + 0x140) = local_7c;
    }
    pAVar11 = std::unique_ptr<AVCodecContext,_(anonymous_namespace)::AVCodecCtxDeleter>::operator->
                        ((unique_ptr<AVCodecContext,_(anonymous_namespace)::AVCodecCtxDeleter> *)
                         0x1128b6);
    if ((((pAVar11->channel_layout == 0x60f) ||
         (pAVar11 = std::unique_ptr<AVCodecContext,_(anonymous_namespace)::AVCodecCtxDeleter>::
                    operator->((unique_ptr<AVCodecContext,_(anonymous_namespace)::AVCodecCtxDeleter>
                                *)0x1128d4), pAVar11->channel_layout == 0x3f)) &&
        (cVar3 = alIsExtensionPresent("AL_EXT_MCFORMATS"), cVar3 != '\0')) &&
       ((local_7c = alGetEnumValue("AL_FORMAT_51CHN16"), local_7c != 0 && (local_7c != -1)))) {
      pAVar11 = std::unique_ptr<AVCodecContext,_(anonymous_namespace)::AVCodecCtxDeleter>::
                operator->((unique_ptr<AVCodecContext,_(anonymous_namespace)::AVCodecCtxDeleter> *)
                           0x112945);
      *(uint64_t *)(in_RDI + 0xf8) = pAVar11->channel_layout;
      *(int *)(in_RDI + 0x144) = *(int *)(in_RDI + 0x144) * 6;
      *(int *)(in_RDI + 0x140) = local_7c;
    }
    pAVar11 = std::unique_ptr<AVCodecContext,_(anonymous_namespace)::AVCodecCtxDeleter>::operator->
                        ((unique_ptr<AVCodecContext,_(anonymous_namespace)::AVCodecCtxDeleter> *)
                         0x112989);
    if (pAVar11->channel_layout == 4) {
      pAVar11 = std::unique_ptr<AVCodecContext,_(anonymous_namespace)::AVCodecCtxDeleter>::
                operator->((unique_ptr<AVCodecContext,_(anonymous_namespace)::AVCodecCtxDeleter> *)
                           0x1129a4);
      *(uint64_t *)(in_RDI + 0xf8) = pAVar11->channel_layout;
      *(undefined4 *)(in_RDI + 0x144) = *(undefined4 *)(in_RDI + 0x144);
      *(undefined4 *)(in_RDI + 0x140) = 0x1101;
    }
    pAVar11 = std::unique_ptr<AVCodecContext,_(anonymous_namespace)::AVCodecCtxDeleter>::operator->
                        ((unique_ptr<AVCodecContext,_(anonymous_namespace)::AVCodecCtxDeleter> *)
                         0x1129e7);
    if (((pAVar11->channel_layout == 0) &&
        (pAVar11 = std::unique_ptr<AVCodecContext,_(anonymous_namespace)::AVCodecCtxDeleter>::
                   operator->((unique_ptr<AVCodecContext,_(anonymous_namespace)::AVCodecCtxDeleter>
                               *)0x112a06), 3 < pAVar11->channels)) &&
       ((cVar3 = alIsExtensionPresent("AL_EXT_BFORMAT"), cVar3 != '\0' &&
        ((local_7c = alGetEnumValue("AL_FORMAT_BFORMAT3D16"), local_7c != 0 && (local_7c != -1))))))
    {
      pAVar11 = std::unique_ptr<AVCodecContext,_(anonymous_namespace)::AVCodecCtxDeleter>::
                operator->((unique_ptr<AVCodecContext,_(anonymous_namespace)::AVCodecCtxDeleter> *)
                           0x112a82);
      _Var26 = std::sqrt<int>(pAVar11->channels);
      iVar6 = (int)_Var26;
      local_ac = iVar6 + -1;
      pAVar11 = std::unique_ptr<AVCodecContext,_(anonymous_namespace)::AVCodecCtxDeleter>::
                operator->((unique_ptr<AVCodecContext,_(anonymous_namespace)::AVCodecCtxDeleter> *)
                           0x112ade);
      if ((iVar6 * iVar6 == pAVar11->channels) ||
         (iVar6 = local_ac + 1, iVar25 = local_ac + 1,
         pAVar11 = std::unique_ptr<AVCodecContext,_(anonymous_namespace)::AVCodecCtxDeleter>::
                   operator->((unique_ptr<AVCodecContext,_(anonymous_namespace)::AVCodecCtxDeleter>
                               *)0x112b22), iVar6 * iVar25 + 2 == pAVar11->channels)) {
        *(int *)(in_RDI + 0x144) = *(int *)(in_RDI + 0x144) << 2;
        *(int *)(in_RDI + 0x140) = local_7c;
      }
    }
    if (*(int *)(in_RDI + 0x140) == 0) {
      *(undefined8 *)(in_RDI + 0xf8) = 3;
      *(int *)(in_RDI + 0x144) = *(int *)(in_RDI + 0x144) << 1;
      *(undefined4 *)(in_RDI + 0x140) = 0x1103;
    }
  }
  local_b8 = (AudioState *)0x0;
  local_bc = 0;
  *(undefined8 *)(in_RDI + 0x108) = 0;
  *(undefined4 *)(in_RDI + 0x118) = 0;
  *(undefined4 *)(in_RDI + 0x114) = 0;
  *(undefined4 *)(in_RDI + 0x110) = 0;
  n = av_frame_alloc();
  std::unique_ptr<AVFrame,_(anonymous_namespace)::AVFrameDeleter>::reset
            ((unique_ptr<AVFrame,_(anonymous_namespace)::AVFrameDeleter> *)
             CONCAT44(in_stack_fffffffffffffad4,in_stack_fffffffffffffad0),
             (pointer)CONCAT44(in_stack_fffffffffffffacc,in_stack_fffffffffffffac8));
  bVar4 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<AVFrame,_(anonymous_namespace)::AVFrameDeleter> *)0x112c26);
  if (bVar4) {
    if (*(long *)(in_RDI + 0xf8) == 0) {
      iVar13 = (anonymous_namespace)::operator____i64((_anonymous_namespace_ *)0x1,n);
      uVar8 = *(undefined4 *)(in_RDI + 0x100);
      pAVar11 = std::unique_ptr<AVCodecContext,_(anonymous_namespace)::AVCodecCtxDeleter>::
                operator->((unique_ptr<AVCodecContext,_(anonymous_namespace)::AVCodecCtxDeleter> *)
                           0x112cd5);
      iVar6 = pAVar11->sample_rate;
      iVar14 = (anonymous_namespace)::operator____i64((_anonymous_namespace_ *)0x1,n);
      pAVar11 = std::unique_ptr<AVCodecContext,_(anonymous_namespace)::AVCodecCtxDeleter>::
                operator->((unique_ptr<AVCodecContext,_(anonymous_namespace)::AVCodecCtxDeleter> *)
                           0x112d04);
      iVar7 = pAVar11->channels;
      pAVar11 = std::unique_ptr<AVCodecContext,_(anonymous_namespace)::AVCodecCtxDeleter>::
                operator->((unique_ptr<AVCodecContext,_(anonymous_namespace)::AVCodecCtxDeleter> *)
                           0x112d30);
      AVar1 = pAVar11->sample_fmt;
      pAVar11 = std::unique_ptr<AVCodecContext,_(anonymous_namespace)::AVCodecCtxDeleter>::
                operator->((unique_ptr<AVCodecContext,_(anonymous_namespace)::AVCodecCtxDeleter> *)
                           0x112d4a);
      iVar25 = pAVar11->sample_rate;
      __a = (allocator_type *)0x0;
      in_stack_fffffffffffffad0 = 0;
      swr_alloc_set_opts(0,iVar13 * 0x10 + -1,uVar8,iVar6,(iVar14 << ((byte)iVar7 & 0x3f)) + -1,
                         AVar1);
      std::unique_ptr<SwrContext,_(anonymous_namespace)::SwrContextDeleter>::reset
                ((unique_ptr<SwrContext,_(anonymous_namespace)::SwrContextDeleter> *)
                 CONCAT44(in_stack_fffffffffffffad4,in_stack_fffffffffffffad0),
                 (pointer)CONCAT44(in_stack_fffffffffffffacc,iVar25));
      local_e0 = 0;
      std::allocator<double>::allocator((allocator<double> *)0x112dd3);
      std::vector<double,_std::allocator<double>_>::vector
                ((vector<double,_std::allocator<double>_> *)
                 CONCAT44(in_stack_fffffffffffffaf4,in_stack_fffffffffffffaf0),
                 (size_type)in_stack_fffffffffffffae8,
                 (value_type_conflict1 *)in_stack_fffffffffffffae0,__a);
      std::allocator<double>::~allocator((allocator<double> *)0x112e04);
      local_9c = 1;
      local_a0 = 1;
      if ((local_95 & 1) == 0) {
        poVar12 = std::operator<<((ostream *)&std::cout,"Found AL_EXT_BFORMAT");
        std::ostream::operator<<(poVar12,std::endl<char,std::char_traits<char>>);
        pvVar15 = std::vector<double,_std::allocator<double>_>::operator[](&local_d8,0);
        *pvVar15 = 0.7071067811865476;
        pvVar15 = std::vector<double,_std::allocator<double>_>::operator[](&local_d8,0x43);
        *pvVar15 = 1.0;
        pvVar15 = std::vector<double,_std::allocator<double>_>::operator[](&local_d8,0x81);
        *pvVar15 = 1.0;
        pvVar15 = std::vector<double,_std::allocator<double>_>::operator[](&local_d8,0xc2);
        *pvVar15 = 1.0;
      }
      else {
        poVar12 = std::operator<<((ostream *)&std::cout,"Found AL_SOFT_bformat_ex");
        std::ostream::operator<<(poVar12,std::endl<char,std::char_traits<char>>);
        pvVar15 = std::vector<double,_std::allocator<double>_>::operator[](&local_d8,0);
        *pvVar15 = 1.0;
        pvVar15 = std::vector<double,_std::allocator<double>_>::operator[](&local_d8,0x41);
        *pvVar15 = 1.0;
        pvVar15 = std::vector<double,_std::allocator<double>_>::operator[](&local_d8,0x82);
        *pvVar15 = 1.0;
        pvVar15 = std::vector<double,_std::allocator<double>_>::operator[](&local_d8,0xc3);
        *pvVar15 = 1.0;
      }
      pSVar16 = std::unique_ptr<SwrContext,_(anonymous_namespace)::SwrContextDeleter>::get
                          ((unique_ptr<SwrContext,_(anonymous_namespace)::SwrContextDeleter> *)
                           CONCAT44(in_stack_fffffffffffffad4,in_stack_fffffffffffffad0));
      pdVar17 = std::vector<double,_std::allocator<double>_>::data
                          ((vector<double,_std::allocator<double>_> *)0x11300c);
      swr_set_matrix(pSVar16,pdVar17,0x40);
      std::vector<double,_std::allocator<double>_>::~vector(in_stack_fffffffffffffae0);
    }
    else {
      uVar22 = *(undefined8 *)(in_RDI + 0xf8);
      uVar8 = *(undefined4 *)(in_RDI + 0x100);
      pAVar11 = std::unique_ptr<AVCodecContext,_(anonymous_namespace)::AVCodecCtxDeleter>::
                operator->((unique_ptr<AVCodecContext,_(anonymous_namespace)::AVCodecCtxDeleter> *)
                           0x113073);
      iVar6 = pAVar11->sample_rate;
      pAVar11 = std::unique_ptr<AVCodecContext,_(anonymous_namespace)::AVCodecCtxDeleter>::
                operator->((unique_ptr<AVCodecContext,_(anonymous_namespace)::AVCodecCtxDeleter> *)
                           0x113091);
      if (pAVar11->channel_layout == 0) {
        pAVar11 = std::unique_ptr<AVCodecContext,_(anonymous_namespace)::AVCodecCtxDeleter>::
                  operator->((unique_ptr<AVCodecContext,_(anonymous_namespace)::AVCodecCtxDeleter> *
                             )0x1130ce);
        local_328 = av_get_default_channel_layout(pAVar11->channels);
      }
      else {
        pAVar11 = std::unique_ptr<AVCodecContext,_(anonymous_namespace)::AVCodecCtxDeleter>::
                  operator->((unique_ptr<AVCodecContext,_(anonymous_namespace)::AVCodecCtxDeleter> *
                             )0x1130ac);
        local_328 = pAVar11->channel_layout;
      }
      pAVar11 = std::unique_ptr<AVCodecContext,_(anonymous_namespace)::AVCodecCtxDeleter>::
                operator->((unique_ptr<AVCodecContext,_(anonymous_namespace)::AVCodecCtxDeleter> *)
                           0x11311e);
      AVar1 = pAVar11->sample_fmt;
      pAVar11 = std::unique_ptr<AVCodecContext,_(anonymous_namespace)::AVCodecCtxDeleter>::
                operator->((unique_ptr<AVCodecContext,_(anonymous_namespace)::AVCodecCtxDeleter> *)
                           0x113138);
      iVar25 = pAVar11->sample_rate;
      __a = (allocator_type *)0x0;
      in_stack_fffffffffffffad0 = 0;
      swr_alloc_set_opts(0,uVar22,uVar8,iVar6,local_328,AVar1);
      std::unique_ptr<SwrContext,_(anonymous_namespace)::SwrContextDeleter>::reset
                ((unique_ptr<SwrContext,_(anonymous_namespace)::SwrContextDeleter> *)
                 CONCAT44(in_stack_fffffffffffffad4,in_stack_fffffffffffffad0),
                 (pointer)CONCAT44(in_stack_fffffffffffffacc,iVar25));
    }
    bVar4 = std::unique_ptr::operator_cast_to_bool
                      ((unique_ptr<SwrContext,_(anonymous_namespace)::SwrContextDeleter> *)0x1131b4)
    ;
    if (bVar4) {
      pSVar16 = std::unique_ptr<SwrContext,_(anonymous_namespace)::SwrContextDeleter>::get
                          ((unique_ptr<SwrContext,_(anonymous_namespace)::SwrContextDeleter> *)
                           CONCAT44(in_stack_fffffffffffffad4,in_stack_fffffffffffffad0));
      iVar6 = swr_init(pSVar16);
      if (iVar6 == 0) {
        sVar9 = std::array<unsigned_int,_40UL>::size((array<unsigned_int,_40UL> *)(in_RDI + 0x1a8));
        pvVar18 = std::array<unsigned_int,_40UL>::data((array<unsigned_int,_40UL> *)0x113253);
        alGenBuffers(sVar9 & 0xffffffff,pvVar18);
        alGenSources(1,in_RDI + 0x1a4);
        if ((anonymous_namespace)::DirectOutMode != 0) {
          alSourcei(*(undefined4 *)(in_RDI + 0x1a4),0x1033,(anonymous_namespace)::DirectOutMode);
        }
        if (((anonymous_namespace)::EnableWideStereo & 1) != 0) {
          local_f0[0] = 0xbf860a923f860a92;
          alSourcefv(*(undefined4 *)(in_RDI + 0x1a4),0x1030,local_f0);
        }
        if ((local_95 & 1) != 0) {
          local_f8 = in_RDI + 0x1a8;
          local_100 = std::array<unsigned_int,_40UL>::begin((array<unsigned_int,_40UL> *)0x11331a);
          local_108 = std::array<unsigned_int,_40UL>::end((array<unsigned_int,_40UL> *)0x11332f);
          for (; local_100 != local_108; local_100 = local_100 + 1) {
            local_10c = *local_100;
            alBufferi(local_10c,0x1997,local_9c);
            alBufferi(local_10c,0x1998,local_a0);
          }
        }
        iVar6 = alGetError();
        pcVar27 = (anonymous_namespace)::alBufferCallbackSOFT;
        if (iVar6 == 0) {
          if ((anonymous_namespace)::alBufferCallbackSOFT == (code *)0x0) {
            std::unique_ptr<AVCodecContext,_(anonymous_namespace)::AVCodecCtxDeleter>::operator->
                      ((unique_ptr<AVCodecContext,_(anonymous_namespace)::AVCodecCtxDeleter> *)
                       0x1138e8);
            local_168 = (rep)std::chrono::operator*
                                       ((int *)CONCAT44(in_stack_fffffffffffffacc,iVar25),
                                        (duration<long,_std::ratio<1L,_1000L>_> *)0x1138fe);
            local_160.__r =
                 (rep)std::chrono::
                      duration_cast<std::chrono::duration<long,std::ratio<1l,1l>>,long,std::ratio<1l,1000l>>
                                ((duration<long,_std::ratio<1L,_1000L>_> *)
                                 CONCAT44(in_stack_fffffffffffffacc,iVar25));
            rVar20 = std::chrono::duration<long,_std::ratio<1L,_1L>_>::count(&local_160);
            local_bc = (int)rVar20 * *(int *)(in_RDI + 0x144);
          }
          else {
            pvVar19 = std::array<unsigned_int,_40UL>::operator[]
                                ((array<unsigned_int,_40UL> *)
                                 CONCAT44(in_stack_fffffffffffffad4,in_stack_fffffffffffffad0),
                                 CONCAT44(in_stack_fffffffffffffacc,iVar25));
            vVar2 = *pvVar19;
            uVar8 = *(undefined4 *)(in_RDI + 0x140);
            pAVar11 = std::unique_ptr<AVCodecContext,_(anonymous_namespace)::AVCodecCtxDeleter>::
                      operator->((unique_ptr<AVCodecContext,_(anonymous_namespace)::AVCodecCtxDeleter>
                                  *)0x11342a);
            (*pcVar27)(vVar2,uVar8,pAVar11->sample_rate,bufferCallbackC,in_RDI,0);
            uVar8 = *(undefined4 *)(in_RDI + 0x1a4);
            pvVar19 = std::array<unsigned_int,_40UL>::operator[]
                                ((array<unsigned_int,_40UL> *)
                                 CONCAT44(in_stack_fffffffffffffad4,in_stack_fffffffffffffad0),
                                 CONCAT44(in_stack_fffffffffffffacc,iVar25));
            alSourcei(uVar8,0x1009,*pvVar19);
            iVar6 = alGetError();
            if (iVar6 == 0) {
              std::unique_ptr<AVCodecContext,_(anonymous_namespace)::AVCodecCtxDeleter>::operator->
                        ((unique_ptr<AVCodecContext,_(anonymous_namespace)::AVCodecCtxDeleter> *)
                         0x1135b2);
              local_130 = (rep)std::chrono::operator*
                                         ((int *)CONCAT44(in_stack_fffffffffffffacc,iVar25),
                                          (duration<long,_std::ratio<1L,_1000L>_> *)0x1135c8);
              local_128.__r =
                   (rep)std::chrono::
                        duration_cast<std::chrono::duration<long,std::ratio<1l,1l>>,long,std::ratio<1l,1000l>>
                                  ((duration<long,_std::ratio<1L,_1000L>_> *)
                                   CONCAT44(in_stack_fffffffffffffacc,iVar25));
              rVar20 = std::chrono::duration<long,_std::ratio<1L,_1L>_>::count(&local_128);
              *(ulong *)(in_RDI + 0x128) = rVar20 * (ulong)*(uint *)(in_RDI + 0x144);
              operator_new__(*(ulong *)(in_RDI + 0x128));
              std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>::
              reset<unsigned_char*,void>
                        ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)
                         CONCAT44(in_stack_fffffffffffffad4,in_stack_fffffffffffffad0),
                         (uchar *)CONCAT44(in_stack_fffffffffffffacc,iVar25));
              puVar21 = (undefined8 *)(in_RDI + 0x130);
              local_10 = 0;
              local_14 = 0;
              local_8 = puVar21;
              local_18 = std::operator&(memory_order_relaxed,__memory_order_mask);
              local_20 = local_10;
              if (local_14 == 3) {
                *puVar21 = local_10;
              }
              else if (local_14 == 5) {
                LOCK();
                *puVar21 = local_10;
                UNLOCK();
              }
              else {
                *puVar21 = local_10;
              }
              puVar21 = (undefined8 *)(in_RDI + 0x138);
              local_30 = 0;
              local_34 = 0;
              local_28 = puVar21;
              local_38 = std::operator&(memory_order_relaxed,__memory_order_mask);
              local_40 = local_30;
              if (local_34 == 3) {
                *puVar21 = local_30;
              }
              else if (local_34 == 5) {
                LOCK();
                *puVar21 = local_30;
                UNLOCK();
              }
              else {
                *puVar21 = local_30;
              }
              local_134 = 0;
              uVar22 = alcGetCurrentContext();
              uVar22 = alcGetContextsDevice(uVar22);
              alcGetIntegerv(uVar22,0x1008,1,&local_134);
              local_154 = 1;
              std::chrono::duration<long,std::ratio<1l,1l>>::duration<int,void>
                        (local_150,&local_154);
              std::chrono::duration<long,std::ratio<1l,1000l>>::
              duration<long,std::ratio<1l,1l>,void>
                        ((duration<long,_std::ratio<1L,_1000L>_> *)in_stack_fffffffffffffae0,
                         (duration<long,_std::ratio<1L,_1L>_> *)__a);
              local_140 = (rep)std::chrono::operator/
                                         ((duration<long,_std::ratio<1L,_1000L>_> *)__a,
                                          (int *)CONCAT44(in_stack_fffffffffffffad4,
                                                          in_stack_fffffffffffffad0));
              local_78 = local_140;
            }
            else {
              fprintf(_stderr,"Failed to set buffer callback\n");
              alSourcei(*(undefined4 *)(in_RDI + 0x1a4),0x1009,0);
              std::unique_ptr<AVCodecContext,_(anonymous_namespace)::AVCodecCtxDeleter>::operator->
                        ((unique_ptr<AVCodecContext,_(anonymous_namespace)::AVCodecCtxDeleter> *)
                         0x11350d);
              local_120 = (rep)std::chrono::operator*
                                         ((int *)CONCAT44(in_stack_fffffffffffffacc,iVar25),
                                          (duration<long,_std::ratio<1L,_1000L>_> *)0x113523);
              local_118.__r =
                   (rep)std::chrono::
                        duration_cast<std::chrono::duration<long,std::ratio<1l,1l>>,long,std::ratio<1l,1000l>>
                                  ((duration<long,_std::ratio<1L,_1000L>_> *)
                                   CONCAT44(in_stack_fffffffffffffacc,iVar25));
              rVar20 = std::chrono::duration<long,_std::ratio<1L,_1L>_>::count(&local_118);
              local_bc = (int)rVar20 * *(int *)(in_RDI + 0x144);
            }
          }
          if (0 < local_bc) {
            in_stack_fffffffffffffbd0 = (AudioState *)av_malloc(local_bc);
            local_b8 = in_stack_fffffffffffffbd0;
          }
          do {
            std::unique_ptr<AVCodecContext,_(anonymous_namespace)::AVCodecCtxDeleter>::get
                      ((unique_ptr<AVCodecContext,_(anonymous_namespace)::AVCodecCtxDeleter> *)
                       CONCAT44(in_stack_fffffffffffffad4,in_stack_fffffffffffffad0));
            iVar6 = PacketQueue<2097152UL>::sendTo
                              (in_stack_fffffffffffffb28,in_stack_fffffffffffffb20);
            local_16c = iVar6;
            if (iVar6 == -0xb) break;
          } while (iVar6 != -0x20464f45);
          std::unique_lock<std::mutex>::lock
                    ((unique_lock<std::mutex> *)
                     CONCAT44(in_stack_fffffffffffffad4,in_stack_fffffffffffffad0));
          pcVar27 = (anonymous_namespace)::alcGetInteger64vSOFT;
          if ((anonymous_namespace)::alcGetInteger64vSOFT != (code *)0x0) {
            local_178 = 0;
            uVar22 = alcGetCurrentContext();
            uVar22 = alcGetContextsDevice(uVar22);
            (*pcVar27)(uVar22,0x1600,1,&local_178);
            std::chrono::duration<long,std::ratio<1l,1000000000l>>::duration<long,void>
                      (local_188,&local_178);
            local_180 = (rep)std::chrono::operator-
                                       (in_stack_fffffffffffffae8,
                                        (duration<long,_std::ratio<1L,_1000000000L>_> *)
                                        in_stack_fffffffffffffae0);
            *(rep *)(in_RDI + 0xe0) = local_180;
          }
          iVar7 = decodeFrame((AudioState *)
                              CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48));
          *(int *)(in_RDI + 0x110) = iVar7;
          if (0 < *(int *)(in_RDI + 0x110)) {
            local_18c = getSync((AudioState *)
                                CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58));
            piVar23 = std::min<int>((int *)(in_RDI + 0x110),&local_18c);
            *(int *)(in_RDI + 0x114) = *piVar23;
            std::chrono::duration<long,std::ratio<1l,1l>>::duration<int,void>
                      (local_1a8,(int *)(in_RDI + 0x114));
            std::chrono::duration<long,std::ratio<1l,1000000000l>>::
            duration<long,std::ratio<1l,1l>,void>
                      ((duration<long,_std::ratio<1L,_1000000000L>_> *)in_stack_fffffffffffffae0,
                       (duration<long,_std::ratio<1L,_1L>_> *)__a);
            std::unique_ptr<AVCodecContext,_(anonymous_namespace)::AVCodecCtxDeleter>::operator->
                      ((unique_ptr<AVCodecContext,_(anonymous_namespace)::AVCodecCtxDeleter> *)
                       0x113be2);
            local_198 = (rep)std::chrono::operator/
                                       ((duration<long,_std::ratio<1L,_1000000000L>_> *)__a,
                                        (int *)CONCAT44(in_stack_fffffffffffffad4,
                                                        in_stack_fffffffffffffad0));
            std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>::operator-=
                      ((duration<long,_std::ratio<1L,_1000000000L>_> *)
                       CONCAT44(in_stack_fffffffffffffad4,in_stack_fffffffffffffad0),
                       (duration<long,_std::ratio<1L,_1000000000L>_> *)
                       CONCAT44(in_stack_fffffffffffffacc,iVar25));
            std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>::operator+=
                      ((duration<long,_std::ratio<1L,_1000000000L>_> *)
                       CONCAT44(in_stack_fffffffffffffad4,in_stack_fffffffffffffad0),
                       (duration<long,_std::ratio<1L,_1000000000L>_> *)
                       CONCAT44(in_stack_fffffffffffffacc,iVar25));
          }
LAB_00113c53:
          bVar5 = std::atomic<bool>::load((atomic<bool> *)__a,in_stack_fffffffffffffad4);
          bVar4 = false;
          if (!bVar5) {
            local_48 = (char *)(in_RDI + 0x1a0);
            local_4c = 0;
            LOCK();
            cVar3 = *local_48;
            *local_48 = '\x01';
            UNLOCK();
            bVar4 = cVar3 != '\0';
          }
          if (!bVar4) {
LAB_001141bb:
            alSourceRewind(*(undefined4 *)(in_RDI + 0x1a4));
            alSourcei(*(undefined4 *)(in_RDI + 0x1a4),0x1009,0);
            std::unique_lock<std::mutex>::unlock
                      ((unique_lock<std::mutex> *)
                       CONCAT44(in_stack_fffffffffffffad4,in_stack_fffffffffffffad0));
            goto LAB_001141fd;
          }
          if (*(long *)(in_RDI + 0x128) == 0) {
            alGetSourcei(*(undefined4 *)(in_RDI + 0x1a4),0x1016,&local_1b0);
            for (; 0 < local_1b0; local_1b0 = local_1b0 + -1) {
              alSourceUnqueueBuffers(*(undefined4 *)(in_RDI + 0x1a4),1,local_1b8);
            }
            in_stack_fffffffffffffb5c =
                 getSync((AudioState *)CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58)
                        );
            local_1bc = in_stack_fffffffffffffb5c;
            alGetSourcei(*(undefined4 *)(in_RDI + 0x1a4),0x1015,&local_1b4);
            while( true ) {
              samples_00 = (uint8_t *)(ulong)local_1b4;
              puVar24 = (uint8_t *)
                        std::array<unsigned_int,_40UL>::size
                                  ((array<unsigned_int,_40UL> *)(in_RDI + 0x1a8));
              if (puVar24 <= samples_00) break;
              local_1bd = readAudio((AudioState *)
                                    CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58),
                                    samples_00,in_stack_fffffffffffffb4c,
                                    (int *)in_stack_fffffffffffffb40);
              in_stack_fffffffffffffb4c = CONCAT13(local_1bd,(int3)in_stack_fffffffffffffb4c);
              if (!(bool)local_1bd) break;
              this_00 = (array<unsigned_int,_40UL> *)(in_RDI + 0x1a8);
              pvVar19 = std::array<unsigned_int,_40UL>::operator[]
                                  ((array<unsigned_int,_40UL> *)
                                   CONCAT44(in_stack_fffffffffffffad4,in_stack_fffffffffffffad0),
                                   CONCAT44(in_stack_fffffffffffffacc,iVar25));
              local_1c4 = *pvVar19;
              iVar7 = *(int *)(in_RDI + 0x248);
              sVar9 = std::array<unsigned_int,_40UL>::size(this_00);
              vVar2 = local_1c4;
              *(int *)(in_RDI + 0x248) = (int)((ulong)(iVar7 + 1) % sVar9);
              uVar8 = *(undefined4 *)(in_RDI + 0x140);
              in_stack_fffffffffffffb40 = local_b8;
              iVar7 = local_bc;
              pAVar11 = std::unique_ptr<AVCodecContext,_(anonymous_namespace)::AVCodecCtxDeleter>::
                        operator->((unique_ptr<AVCodecContext,_(anonymous_namespace)::AVCodecCtxDeleter>
                                    *)0x113fa0);
              alBufferData(vVar2,uVar8,in_stack_fffffffffffffb40,iVar7,pAVar11->sample_rate);
              alSourceQueueBuffers(*(undefined4 *)(in_RDI + 0x1a4),1,&local_1c4);
              local_1b4 = local_1b4 + 1;
            }
            alGetSourcei(*(undefined4 *)(in_RDI + 0x1a4),0x1010,&local_1ac);
            if (local_1ac != 0x1014) goto LAB_00114126;
            alSourceRewind(*(undefined4 *)(in_RDI + 0x1a4));
            alSourcei(*(undefined4 *)(in_RDI + 0x1a4),0x1009,0);
            pcVar27 = (anonymous_namespace)::alcGetInteger64vSOFT;
            if ((anonymous_namespace)::alcGetInteger64vSOFT != (code *)0x0) {
              local_1d0 = 0;
              uVar22 = alcGetCurrentContext();
              uVar22 = alcGetContextsDevice(uVar22);
              (*pcVar27)(uVar22,0x1600,1,&local_1d0);
              std::chrono::duration<long,std::ratio<1l,1000000000l>>::duration<long,void>
                        (local_1e0,&local_1d0);
              local_1d8 = (rep)std::chrono::operator-
                                         (in_stack_fffffffffffffae8,
                                          (duration<long,_std::ratio<1L,_1000000000L>_> *)
                                          in_stack_fffffffffffffae0);
              *(rep *)(in_RDI + 0xe0) = local_1d8;
            }
            goto LAB_00113c53;
          }
          alGetSourcei(*(undefined4 *)(in_RDI + 0x1a4),0x1010,&local_1ac);
          getSync((AudioState *)CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58));
          readAudio(in_stack_fffffffffffffbd0,iVar6);
LAB_00114126:
          if ((local_1ac != 0x1012) && (local_1ac != 0x1013)) {
            bVar4 = startPlayback((AudioState *)CONCAT44(iVar6,in_stack_fffffffffffffbc8));
            in_stack_fffffffffffffb04 = CONCAT13(bVar4,(int3)in_stack_fffffffffffffb04);
            if (!bVar4) goto LAB_001141bb;
          }
          iVar7 = alGetError();
          if (iVar7 == 0) {
            std::condition_variable::wait_for<long,std::ratio<1l,1000l>>
                      ((condition_variable *)((ulong)in_stack_fffffffffffffb04 << 0x20),
                       in_stack_fffffffffffffaf8,
                       (duration<long,_std::ratio<1L,_1000L>_> *)
                       CONCAT44(in_stack_fffffffffffffaf4,in_stack_fffffffffffffaf0));
            goto LAB_00113c53;
          }
          goto LAB_0011427e;
        }
        goto LAB_001141fd;
      }
    }
    poVar12 = std::operator<<((ostream *)&std::cerr,"Failed to initialize audio converter");
    std::ostream::operator<<(poVar12,std::endl<char,std::char_traits<char>>);
  }
  else {
    poVar12 = std::operator<<((ostream *)&std::cerr,"Failed to allocate audio frame");
    std::ostream::operator<<(poVar12,std::endl<char,std::char_traits<char>>);
  }
LAB_001141fd:
  av_freep(&local_b8);
  if ((anonymous_namespace)::alEventControlSOFT != (code *)0x0) {
    pcVar27 = (anonymous_namespace)::alEventControlSOFT;
    sVar9 = std::array<int,_3UL>::size(&local_88);
    uVar8 = (undefined4)sVar9;
    pvVar10 = std::array<int,_3UL>::data((array<int,_3UL> *)0x114242);
    (*pcVar27)(uVar8,pvVar10,0);
    (*(anonymous_namespace)::alEventCallbackSOFT)(0);
  }
LAB_0011427e:
  local_50 = 0;
  std::unique_lock<std::mutex>::~unique_lock
            ((unique_lock<std::mutex> *)
             CONCAT44(in_stack_fffffffffffffad4,in_stack_fffffffffffffad0));
  return local_50;
}

Assistant:

int AudioState::handler()
{
    std::unique_lock<std::mutex> srclock{mSrcMutex, std::defer_lock};
    milliseconds sleep_time{AudioBufferTime / 3};
    ALenum fmt;

#ifdef AL_SOFT_events
    const std::array<ALenum,3> evt_types{{
        AL_EVENT_TYPE_BUFFER_COMPLETED_SOFT, AL_EVENT_TYPE_SOURCE_STATE_CHANGED_SOFT,
        AL_EVENT_TYPE_DISCONNECTED_SOFT}};
    if(alEventControlSOFT)
    {
        alEventControlSOFT(evt_types.size(), evt_types.data(), AL_TRUE);
        alEventCallbackSOFT(EventCallback, this);
        sleep_time = AudioBufferTotalTime;
    }
#endif
#ifdef AL_SOFT_bformat_ex
    const bool has_bfmt_ex{alIsExtensionPresent("AL_SOFT_bformat_ex") != AL_FALSE};
    ALenum ambi_layout{AL_FUMA_SOFT};
    ALenum ambi_scale{AL_FUMA_SOFT};
#endif

    /* Find a suitable format for OpenAL. */
    mDstChanLayout = 0;
    mFormat = AL_NONE;
    if((mCodecCtx->sample_fmt == AV_SAMPLE_FMT_FLT || mCodecCtx->sample_fmt == AV_SAMPLE_FMT_FLTP) &&
       alIsExtensionPresent("AL_EXT_FLOAT32"))
    {
        mDstSampleFmt = AV_SAMPLE_FMT_FLT;
        mFrameSize = 4;
        if(mCodecCtx->channel_layout == AV_CH_LAYOUT_7POINT1 &&
           alIsExtensionPresent("AL_EXT_MCFORMATS") &&
           (fmt=alGetEnumValue("AL_FORMAT_71CHN32")) != AL_NONE && fmt != -1)
        {
            mDstChanLayout = mCodecCtx->channel_layout;
            mFrameSize *= 8;
            mFormat = fmt;
        }
        if((mCodecCtx->channel_layout == AV_CH_LAYOUT_5POINT1 ||
            mCodecCtx->channel_layout == AV_CH_LAYOUT_5POINT1_BACK) &&
           alIsExtensionPresent("AL_EXT_MCFORMATS") &&
           (fmt=alGetEnumValue("AL_FORMAT_51CHN32")) != AL_NONE && fmt != -1)
        {
            mDstChanLayout = mCodecCtx->channel_layout;
            mFrameSize *= 6;
            mFormat = fmt;
        }
        if(mCodecCtx->channel_layout == AV_CH_LAYOUT_MONO)
        {
            mDstChanLayout = mCodecCtx->channel_layout;
            mFrameSize *= 1;
            mFormat = AL_FORMAT_MONO_FLOAT32;
        }
        /* Assume 3D B-Format (ambisonics) if the channel layout is blank and
         * there's 4 or more channels. FFmpeg/libavcodec otherwise seems to
         * have no way to specify if the source is actually B-Format (let alone
         * if it's 2D or 3D).
         */
        if(mCodecCtx->channel_layout == 0 && mCodecCtx->channels >= 4 &&
           alIsExtensionPresent("AL_EXT_BFORMAT") &&
           (fmt=alGetEnumValue("AL_FORMAT_BFORMAT3D_FLOAT32")) != AL_NONE && fmt != -1)
        {
            int order{static_cast<int>(std::sqrt(mCodecCtx->channels)) - 1};
            if((order+1)*(order+1) == mCodecCtx->channels ||
               (order+1)*(order+1) + 2 == mCodecCtx->channels)
            {
                /* OpenAL only supports first-order with AL_EXT_BFORMAT, which
                 * is 4 channels for 3D buffers.
                 */
                mFrameSize *= 4;
                mFormat = fmt;
            }
        }
        if(!mFormat)
        {
            mDstChanLayout = AV_CH_LAYOUT_STEREO;
            mFrameSize *= 2;
            mFormat = AL_FORMAT_STEREO_FLOAT32;
        }
    }
    if(mCodecCtx->sample_fmt == AV_SAMPLE_FMT_U8 || mCodecCtx->sample_fmt == AV_SAMPLE_FMT_U8P)
    {
        mDstSampleFmt = AV_SAMPLE_FMT_U8;
        mFrameSize = 1;
        if(mCodecCtx->channel_layout == AV_CH_LAYOUT_7POINT1 &&
           alIsExtensionPresent("AL_EXT_MCFORMATS") &&
           (fmt=alGetEnumValue("AL_FORMAT_71CHN8")) != AL_NONE && fmt != -1)
        {
            mDstChanLayout = mCodecCtx->channel_layout;
            mFrameSize *= 8;
            mFormat = fmt;
        }
        if((mCodecCtx->channel_layout == AV_CH_LAYOUT_5POINT1 ||
            mCodecCtx->channel_layout == AV_CH_LAYOUT_5POINT1_BACK) &&
           alIsExtensionPresent("AL_EXT_MCFORMATS") &&
           (fmt=alGetEnumValue("AL_FORMAT_51CHN8")) != AL_NONE && fmt != -1)
        {
            mDstChanLayout = mCodecCtx->channel_layout;
            mFrameSize *= 6;
            mFormat = fmt;
        }
        if(mCodecCtx->channel_layout == AV_CH_LAYOUT_MONO)
        {
            mDstChanLayout = mCodecCtx->channel_layout;
            mFrameSize *= 1;
            mFormat = AL_FORMAT_MONO8;
        }
        if(mCodecCtx->channel_layout == 0 && mCodecCtx->channels >= 4 &&
           alIsExtensionPresent("AL_EXT_BFORMAT") &&
           (fmt=alGetEnumValue("AL_FORMAT_BFORMAT3D8")) != AL_NONE && fmt != -1)
        {
            int order{static_cast<int>(std::sqrt(mCodecCtx->channels)) - 1};
            if((order+1)*(order+1) == mCodecCtx->channels ||
               (order+1)*(order+1) + 2 == mCodecCtx->channels)
            {
                mFrameSize *= 4;
                mFormat = fmt;
            }
        }
        if(!mFormat)
        {
            mDstChanLayout = AV_CH_LAYOUT_STEREO;
            mFrameSize *= 2;
            mFormat = AL_FORMAT_STEREO8;
        }
    }
    if(!mFormat)
    {
        mDstSampleFmt = AV_SAMPLE_FMT_S16;
        mFrameSize = 2;
        if(mCodecCtx->channel_layout == AV_CH_LAYOUT_7POINT1 &&
           alIsExtensionPresent("AL_EXT_MCFORMATS") &&
           (fmt=alGetEnumValue("AL_FORMAT_71CHN16")) != AL_NONE && fmt != -1)
        {
            mDstChanLayout = mCodecCtx->channel_layout;
            mFrameSize *= 8;
            mFormat = fmt;
        }
        if((mCodecCtx->channel_layout == AV_CH_LAYOUT_5POINT1 ||
            mCodecCtx->channel_layout == AV_CH_LAYOUT_5POINT1_BACK) &&
           alIsExtensionPresent("AL_EXT_MCFORMATS") &&
           (fmt=alGetEnumValue("AL_FORMAT_51CHN16")) != AL_NONE && fmt != -1)
        {
            mDstChanLayout = mCodecCtx->channel_layout;
            mFrameSize *= 6;
            mFormat = fmt;
        }
        if(mCodecCtx->channel_layout == AV_CH_LAYOUT_MONO)
        {
            mDstChanLayout = mCodecCtx->channel_layout;
            mFrameSize *= 1;
            mFormat = AL_FORMAT_MONO16;
        }
        if(mCodecCtx->channel_layout == 0 && mCodecCtx->channels >= 4 &&
           alIsExtensionPresent("AL_EXT_BFORMAT") &&
           (fmt=alGetEnumValue("AL_FORMAT_BFORMAT3D16")) != AL_NONE && fmt != -1)
        {
            int order{static_cast<int>(std::sqrt(mCodecCtx->channels)) - 1};
            if((order+1)*(order+1) == mCodecCtx->channels ||
               (order+1)*(order+1) + 2 == mCodecCtx->channels)
            {
                mFrameSize *= 4;
                mFormat = fmt;
            }
        }
        if(!mFormat)
        {
            mDstChanLayout = AV_CH_LAYOUT_STEREO;
            mFrameSize *= 2;
            mFormat = AL_FORMAT_STEREO16;
        }
    }
    void *samples{nullptr};
    ALsizei buffer_len{0};

    mSamples = nullptr;
    mSamplesMax = 0;
    mSamplesPos = 0;
    mSamplesLen = 0;

    mDecodedFrame.reset(av_frame_alloc());
    if(!mDecodedFrame)
    {
        std::cerr<< "Failed to allocate audio frame" <<std::endl;
        goto finish;
    }

    if(!mDstChanLayout)
    {
        /* OpenAL only supports first-order ambisonics with AL_EXT_BFORMAT, so
         * we have to drop any extra channels.
         */
        mSwresCtx.reset(swr_alloc_set_opts(nullptr,
            (1_i64<<4)-1, mDstSampleFmt, mCodecCtx->sample_rate,
            (1_i64<<mCodecCtx->channels)-1, mCodecCtx->sample_fmt, mCodecCtx->sample_rate,
            0, nullptr));

        /* Note that ffmpeg/libavcodec has no method to check the ambisonic
         * channel order and normalization, so we can only assume AmbiX as the
         * defacto-standard. This is not true for .amb files, which use FuMa.
         */
        std::vector<double> mtx(64*64, 0.0);
#ifdef AL_SOFT_bformat_ex
        ambi_layout = AL_ACN_SOFT;
        ambi_scale = AL_SN3D_SOFT;
        if(has_bfmt_ex)
        {
            /* An identity matrix that doesn't remix any channels. */
            std::cout<< "Found AL_SOFT_bformat_ex" <<std::endl;
            mtx[0 + 0*64] = 1.0;
            mtx[1 + 1*64] = 1.0;
            mtx[2 + 2*64] = 1.0;
            mtx[3 + 3*64] = 1.0;
        }
        else
#endif
        {
            std::cout<< "Found AL_EXT_BFORMAT" <<std::endl;
            /* Without AL_SOFT_bformat_ex, OpenAL only supports FuMa channel
             * ordering and normalization, so a custom matrix is needed to
             * scale and reorder the source from AmbiX.
             */
            mtx[0 + 0*64] = std::sqrt(0.5);
            mtx[3 + 1*64] = 1.0;
            mtx[1 + 2*64] = 1.0;
            mtx[2 + 3*64] = 1.0;
        }
        swr_set_matrix(mSwresCtx.get(), mtx.data(), 64);
    }
    else
        mSwresCtx.reset(swr_alloc_set_opts(nullptr,
            static_cast<int64_t>(mDstChanLayout), mDstSampleFmt, mCodecCtx->sample_rate,
            mCodecCtx->channel_layout ? static_cast<int64_t>(mCodecCtx->channel_layout)
                : av_get_default_channel_layout(mCodecCtx->channels),
            mCodecCtx->sample_fmt, mCodecCtx->sample_rate,
            0, nullptr));
    if(!mSwresCtx || swr_init(mSwresCtx.get()) != 0)
    {
        std::cerr<< "Failed to initialize audio converter" <<std::endl;
        goto finish;
    }

    alGenBuffers(static_cast<ALsizei>(mBuffers.size()), mBuffers.data());
    alGenSources(1, &mSource);

    if(DirectOutMode)
        alSourcei(mSource, AL_DIRECT_CHANNELS_SOFT, DirectOutMode);
    if(EnableWideStereo)
    {
        const float angles[2]{static_cast<float>(M_PI / 3.0), static_cast<float>(-M_PI / 3.0)};
        alSourcefv(mSource, AL_STEREO_ANGLES, angles);
    }
#ifdef AL_SOFT_bformat_ex
    if(has_bfmt_ex)
    {
        for(ALuint bufid : mBuffers)
        {
            alBufferi(bufid, AL_AMBISONIC_LAYOUT_SOFT, ambi_layout);
            alBufferi(bufid, AL_AMBISONIC_SCALING_SOFT, ambi_scale);
        }
    }
#endif

    if(alGetError() != AL_NO_ERROR)
        goto finish;

#ifdef AL_SOFT_callback_buffer
    if(alBufferCallbackSOFT)
    {
        alBufferCallbackSOFT(mBuffers[0], mFormat, mCodecCtx->sample_rate, bufferCallbackC, this,
            0);
        alSourcei(mSource, AL_BUFFER, static_cast<ALint>(mBuffers[0]));
        if(alGetError() != AL_NO_ERROR)
        {
            fprintf(stderr, "Failed to set buffer callback\n");
            alSourcei(mSource, AL_BUFFER, 0);
            buffer_len = static_cast<int>(duration_cast<seconds>(mCodecCtx->sample_rate *
                AudioBufferTime).count() * mFrameSize);
        }
        else
        {
            mBufferDataSize = static_cast<size_t>(duration_cast<seconds>(mCodecCtx->sample_rate *
                AudioBufferTotalTime).count()) * mFrameSize;
            mBufferData.reset(new uint8_t[mBufferDataSize]);
            mReadPos.store(0, std::memory_order_relaxed);
            mWritePos.store(0, std::memory_order_relaxed);

            ALCint refresh{};
            alcGetIntegerv(alcGetContextsDevice(alcGetCurrentContext()), ALC_REFRESH, 1, &refresh);
            sleep_time = milliseconds{seconds{1}} / refresh;
        }
    }
    else
#endif
        buffer_len = static_cast<int>(duration_cast<seconds>(mCodecCtx->sample_rate *
            AudioBufferTime).count() * mFrameSize);
    if(buffer_len > 0)
        samples = av_malloc(static_cast<ALuint>(buffer_len));

    /* Prefill the codec buffer. */
    do {
        const int ret{mPackets.sendTo(mCodecCtx.get())};
        if(ret == AVERROR(EAGAIN) || ret == AVErrorEOF)
            break;
    } while(1);

    srclock.lock();
    if(alcGetInteger64vSOFT)
    {
        int64_t devtime{};
        alcGetInteger64vSOFT(alcGetContextsDevice(alcGetCurrentContext()), ALC_DEVICE_CLOCK_SOFT,
            1, &devtime);
        mDeviceStartTime = nanoseconds{devtime} - mCurrentPts;
    }

    mSamplesLen = decodeFrame();
    if(mSamplesLen > 0)
    {
        mSamplesPos = std::min(mSamplesLen, getSync());

        auto skip = nanoseconds{seconds{mSamplesPos}} / mCodecCtx->sample_rate;
        mDeviceStartTime -= skip;
        mCurrentPts += skip;
    }

    while(!mMovie.mQuit.load(std::memory_order_relaxed)
        && mConnected.test_and_set(std::memory_order_relaxed))
    {
        ALenum state;
        if(mBufferDataSize > 0)
        {
            alGetSourcei(mSource, AL_SOURCE_STATE, &state);
            readAudio(getSync());
        }
        else
        {
            ALint processed, queued;

            /* First remove any processed buffers. */
            alGetSourcei(mSource, AL_BUFFERS_PROCESSED, &processed);
            while(processed > 0)
            {
                ALuint bid;
                alSourceUnqueueBuffers(mSource, 1, &bid);
                --processed;
            }

            /* Refill the buffer queue. */
            int sync_skip{getSync()};
            alGetSourcei(mSource, AL_BUFFERS_QUEUED, &queued);
            while(static_cast<ALuint>(queued) < mBuffers.size())
            {
                /* Read the next chunk of data, filling the buffer, and queue
                 * it on the source.
                 */
                const bool got_audio{readAudio(static_cast<uint8_t*>(samples),
                    static_cast<ALuint>(buffer_len), sync_skip)};
                if(!got_audio) break;

                const ALuint bufid{mBuffers[mBufferIdx]};
                mBufferIdx = static_cast<ALuint>((mBufferIdx+1) % mBuffers.size());

                alBufferData(bufid, mFormat, samples, buffer_len, mCodecCtx->sample_rate);
                alSourceQueueBuffers(mSource, 1, &bufid);
                ++queued;
            }

            /* Check that the source is playing. */
            alGetSourcei(mSource, AL_SOURCE_STATE, &state);
            if(state == AL_STOPPED)
            {
                /* AL_STOPPED means there was an underrun. Clear the buffer
                 * queue since this likely means we're late, and rewind the
                 * source to get it back into an AL_INITIAL state.
                 */
                alSourceRewind(mSource);
                alSourcei(mSource, AL_BUFFER, 0);
                if(alcGetInteger64vSOFT)
                {
                    /* Also update the device start time with the current
                     * device clock, so the decoder knows we're running behind.
                     */
                    int64_t devtime{};
                    alcGetInteger64vSOFT(alcGetContextsDevice(alcGetCurrentContext()),
                        ALC_DEVICE_CLOCK_SOFT, 1, &devtime);
                    mDeviceStartTime = nanoseconds{devtime} - mCurrentPts;
                }
                continue;
            }
        }

        /* (re)start the source if needed, and wait for a buffer to finish */
        if(state != AL_PLAYING && state != AL_PAUSED)
        {
            if(!startPlayback())
                break;
        }
        if(alGetError() != AL_NO_ERROR)
            return false;

        mSrcCond.wait_for(srclock, sleep_time);
    }

    alSourceRewind(mSource);
    alSourcei(mSource, AL_BUFFER, 0);
    srclock.unlock();

finish:
    av_freep(&samples);

#ifdef AL_SOFT_events
    if(alEventControlSOFT)
    {
        alEventControlSOFT(evt_types.size(), evt_types.data(), AL_FALSE);
        alEventCallbackSOFT(nullptr, nullptr);
    }
#endif

    return 0;
}